

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void BM_Check2(int n)

{
  uint uVar1;
  ostream *poVar2;
  LogMessage LStack_68;
  
  if (n == 0x11) {
    x = 1;
    uVar1 = 5;
  }
  else {
    uVar1 = (x & 1) - 1 | 5;
  }
  if (n <= (int)uVar1) {
    uVar1 = n;
  }
  if ((uint)(~(n >> 0x1f) & n) <= n - uVar1) {
    return;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x9e);
  poVar2 = google::LogMessage::stream(&LStack_68);
  std::operator<<(poVar2,"Check failed: n >= x ");
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_68);
}

Assistant:

static void BM_Check2(int n) {
  if (n == 17) {
    x = 5;
  }
  while (n-- > 0) {
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
  }
}